

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O0

tsize_t __thiscall
TIFFImageHandler::SampleLABSignedToUnsigned
          (TIFFImageHandler *this,tdata_t inBuffer,uint32_t inSampleCount)

{
  ulong uVar1;
  undefined4 local_20;
  uint32_t i;
  uint32_t inSampleCount_local;
  tdata_t inBuffer_local;
  TIFFImageHandler *this_local;
  
  for (local_20 = 0; local_20 < inSampleCount; local_20 = local_20 + 1) {
    if ((*(byte *)((long)inBuffer + (ulong)(local_20 * 3 + 1)) & 0x80) == 0) {
      uVar1 = (ulong)(local_20 * 3 + 1);
      *(byte *)((long)inBuffer + uVar1) = *(byte *)((long)inBuffer + uVar1) | 0x80;
    }
    else {
      *(char *)((long)inBuffer + (ulong)(local_20 * 3 + 1)) =
           *(char *)((long)inBuffer + (ulong)(local_20 * 3 + 1)) + -0x80;
    }
    if ((*(byte *)((long)inBuffer + (ulong)(local_20 * 3 + 2)) & 0x80) == 0) {
      uVar1 = (ulong)(local_20 * 3 + 2);
      *(byte *)((long)inBuffer + uVar1) = *(byte *)((long)inBuffer + uVar1) | 0x80;
    }
    else {
      *(char *)((long)inBuffer + (ulong)(local_20 * 3 + 2)) =
           *(char *)((long)inBuffer + (ulong)(local_20 * 3 + 2)) + -0x80;
    }
  }
  return (ulong)(inSampleCount * 3);
}

Assistant:

tsize_t	TIFFImageHandler::SampleLABSignedToUnsigned(tdata_t inBuffer, uint32_t inSampleCount)
{
	uint32_t i=0;

	for(i=0;i<inSampleCount;i++)
	{
		if( (((unsigned char*)inBuffer)[(i*3)+1] & 0x80) !=0)
		{
			((unsigned char*)inBuffer)[(i*3)+1] =
				(unsigned char)(0x80 + ((char*)inBuffer)[(i*3)+1]);
		} 
		else 
		{
			((unsigned char*)inBuffer)[(i*3)+1] |= 0x80;
		}
		if( (((unsigned char*)inBuffer)[(i*3)+2] & 0x80) !=0)
		{
			((unsigned char*)inBuffer)[(i*3)+2] =
				(unsigned char)(0x80 + ((char*)inBuffer)[(i*3)+2]);
		} 
		else 
		{
			((unsigned char*)inBuffer)[(i*3)+2] |= 0x80;
		}
	}
	return(inSampleCount*3);	
}